

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void rw::ps2::writeNativeTexture(Texture *tex,Stream *stream)

{
  undefined4 *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Raster *pRVar5;
  short sVar6;
  size_t sVar7;
  _func_int **pp_Var8;
  uint8 *puVar9;
  long lVar10;
  undefined8 local_70;
  int local_68;
  ushort local_64;
  short local_62;
  undefined8 local_60;
  undefined4 local_58;
  uint local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined4 local_38;
  uint local_34;
  
  pRVar5 = tex->raster;
  lVar10 = (long)nativeRasterOffset;
  writeChunkHeader(stream,1,8);
  Stream::writeU32(stream,0x325350);
  Stream::writeU32(stream,tex->filterAddressing);
  sVar7 = strlen(tex->name);
  uVar4 = ((uint)sVar7 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar4);
  (*stream->_vptr_Stream[3])(stream,tex->name,(ulong)uVar4);
  sVar7 = strlen(tex->mask);
  uVar4 = ((uint)sVar7 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar4);
  (*stream->_vptr_Stream[3])(stream,tex->mask,(ulong)uVar4);
  iVar3 = *(int *)((long)&pRVar5->stride + lVar10);
  uVar4 = *(int *)(&pRVar5->field_0x24 + lVar10) + iVar3;
  writeChunkHeader(stream,1,*(int *)(&pRVar5->field_0x24 + lVar10) + iVar3 + 0x58);
  writeChunkHeader(stream,1,0x40);
  local_70._0_4_ = pRVar5->width;
  local_70._4_4_ = pRVar5->height;
  local_68 = pRVar5->depth;
  local_64 = (ushort)pRVar5->type | (ushort)pRVar5->format;
  local_62 = 0;
  bVar2 = *(byte *)((long)&pRVar5->pixels + lVar10 + 4);
  if (bVar2 == 2) {
    sVar6 = 1;
    if (local_68 != 8) goto LAB_0012c2e6;
  }
  else {
    sVar6 = 2;
    if ((bVar2 & 1) == 0) goto LAB_0012c2e6;
  }
  local_62 = sVar6;
LAB_0012c2e6:
  local_60 = *(undefined8 *)((long)&pRVar5->platform + lVar10);
  local_58 = *(undefined4 *)((long)&pRVar5->flags + lVar10);
  local_54 = (uint)*(byte *)((long)&pRVar5->privateFlags + lVar10 + 2);
  puVar1 = (undefined4 *)((long)&pRVar5->format + lVar10);
  local_50 = *puVar1;
  uStack_4c = puVar1[1];
  uStack_48 = puVar1[2];
  uStack_44 = puVar1[3];
  local_40 = *(undefined8 *)((long)&pRVar5->stride + lVar10);
  local_38 = *(undefined4 *)((long)&pRVar5->pixels + lVar10);
  local_34 = (uint)*(ushort *)((long)&pRVar5->privateFlags + lVar10);
  (*stream->_vptr_Stream[3])(stream,&local_70,0x40);
  writeChunkHeader(stream,1,uVar4);
  if (local_62 < 2) {
    puVar9 = pRVar5->pixels;
    pp_Var8 = stream->_vptr_Stream;
  }
  else {
    (*stream->_vptr_Stream[3])
              (stream,*(undefined8 *)pRVar5->originalPixels,
               (ulong)*(uint *)((long)&pRVar5->stride + lVar10));
    puVar9 = pRVar5->palette + -0x50;
    uVar4 = *(uint *)(&pRVar5->field_0x24 + lVar10);
    pp_Var8 = stream->_vptr_Stream;
  }
  (*pp_Var8[3])(stream,puVar9,(ulong)uVar4);
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Ps2Raster *ras = GETPS2RASTEREXT(raster);
	writeChunkHeader(stream, ID_STRUCT, 8);
	stream->writeU32(FOURCC_PS2);
	stream->writeU32(tex->filterAddressing);
	int32 len = strlen(tex->name)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->name, len);
	len = strlen(tex->mask)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->mask, len);

	int32 sz = ras->pixelSize + ras->paletteSize;
	writeChunkHeader(stream, ID_STRUCT, 12 + 64 + 12 + sz);
	writeChunkHeader(stream, ID_STRUCT, 64);
	StreamRasterExt streamExt;
	streamExt.width = raster->width;
	streamExt.height = raster->height;
	streamExt.depth = raster->depth;
	streamExt.rasterFormat = raster->format | raster->type;
	streamExt.version = 0;
	if(ras->flags == Ps2Raster::SWIZZLED8 && raster->depth == 8)
		streamExt.version = 1;
	if(ras->flags & Ps2Raster::NEWSTYLE)
		streamExt.version = 2;
	streamExt.tex0 = ras->tex0;
	streamExt.paletteOffset = ras->paletteBase;
	streamExt.tex1low = ras->tex1low;
	streamExt.miptbp1 = ras->miptbp1;
	streamExt.miptbp2 = ras->miptbp2;
	streamExt.pixelSize = ras->pixelSize;
	streamExt.paletteSize = ras->paletteSize;
	streamExt.totalSize = ras->totalSize;
	streamExt.mipmapVal = ras->kl;
	ASSERTLITTLE;
	stream->write8(&streamExt, 64);

	writeChunkHeader(stream, ID_STRUCT, sz);
	if(streamExt.version < 2){
		stream->write8(raster->pixels, sz);
	}else{
		stream->write8(((Ps2Raster::PixelPtr*)raster->originalPixels)->pixels, ras->pixelSize);
		stream->write8(raster->palette-0x50, ras->paletteSize);
	}
}